

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

bool __thiscall miniros::master::NetAdapter::hasAccessTo(NetAdapter *this,HostInfo *host)

{
  bool bVar1;
  NetAdapter *in_RSI;
  NetAddress *in_RDI;
  NetAddress *address;
  iterator __end2;
  iterator __begin2;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *__range2;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  NetAddress *other;
  
  other = &in_RSI->address;
  local_28._M_node =
       (_Base_ptr)
       ::std::
       set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_30._M_node =
       (_Base_ptr)
       ::std::
       set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = ::std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::operator*
              ((_Rb_tree_const_iterator<miniros::network::NetAddress> *)in_RDI);
    bVar1 = network::NetAddress::isLocal(in_RDI);
    if ((!bVar1) && (bVar1 = matchNetAddress(in_RSI,other), bVar1)) break;
    ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::operator++
              ((_Rb_tree_const_iterator<miniros::network::NetAddress> *)in_RDI);
  }
  return true;
}

Assistant:

bool NetAdapter::hasAccessTo(const HostInfo& host) const
{
  for (const auto& address: host.addresses) {
    if (address.isLocal())
      continue;
    if (matchNetAddress(address))
      return true;
  }
  return false;
}